

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnFunction(BinaryReaderIR *this,Index index,Index sig_index)

{
  Module *this_00;
  Index index_00;
  pointer pFVar1;
  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_> local_c0;
  Location local_b8;
  Var local_98;
  Func *local_50;
  Func *func;
  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_> local_28;
  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_> field;
  Index sig_index_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>.
  super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl._0_4_ = sig_index;
  field._M_t.
  super___uniq_ptr_impl<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>.
  super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl._4_4_ = index;
  GetLocation((Location *)&func,this);
  MakeUnique<wabt::FuncModuleField,wabt::Location>((wabt *)&local_28,(Location *)&func);
  pFVar1 = std::unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::
           operator->(&local_28);
  index_00 = (Index)field._M_t.
                    super___uniq_ptr_impl<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wabt::FuncModuleField_*,_std::default_delete<wabt::FuncModuleField>_>
                    .super__Head_base<0UL,_wabt::FuncModuleField_*,_false>._M_head_impl;
  local_50 = &pFVar1->func;
  GetLocation(&local_b8,this);
  Var::Var(&local_98,index_00,&local_b8);
  SetFuncDeclaration(this,&(pFVar1->func).decl,&local_98);
  Var::~Var(&local_98);
  this_00 = this->module_;
  std::unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::unique_ptr
            (&local_c0,&local_28);
  Module::AppendField(this_00,&local_c0);
  std::unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::~unique_ptr
            (&local_c0);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::~unique_ptr
            (&local_28);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnFunction(Index index, Index sig_index) {
  auto field = MakeUnique<FuncModuleField>(GetLocation());
  Func& func = field->func;
  SetFuncDeclaration(&func.decl, Var(sig_index, GetLocation()));
  module_->AppendField(std::move(field));
  return Result::Ok;
}